

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_bool jp2_read_cdef_v2(opj_jp2_v2_t *jp2,uchar *p_cdef_header_data,OPJ_UINT32 p_cdef_header_size,
                         opj_event_mgr_t *p_manager)

{
  void *pvVar1;
  opj_event_mgr_t *in_RCX;
  OPJ_BYTE *in_RSI;
  long in_RDI;
  OPJ_UINT32 l_value;
  unsigned_short i;
  opj_jp2_cdef_info_t *cdef_info;
  uint local_38;
  ushort local_32;
  void *local_30;
  opj_event_mgr_t *local_28;
  OPJ_BYTE *local_18;
  long local_10;
  opj_bool local_4;
  
  if (*(long *)(in_RDI + 0x80) == 0) {
    local_28 = in_RCX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    opj_read_bytes_LE(in_RSI,&local_38,2);
    local_18 = local_18 + 2;
    if ((local_38 & 0xffff) == 0) {
      opj_event_msg_v2(local_28,1,"Number of channel description is equal to zero in CDEF box.\n");
      local_4 = 0;
    }
    else {
      local_30 = malloc((ulong)local_38 * 6);
      pvVar1 = malloc(0x10);
      *(void **)(local_10 + 0x80) = pvVar1;
      **(undefined8 **)(local_10 + 0x80) = local_30;
      *(short *)(*(long *)(local_10 + 0x80) + 8) = (short)local_38;
      for (local_32 = 0; local_32 < *(ushort *)(*(long *)(local_10 + 0x80) + 8);
          local_32 = local_32 + 1) {
        opj_read_bytes_LE(local_18,&local_38,2);
        local_18 = local_18 + 2;
        *(short *)((long)local_30 + (ulong)local_32 * 6) = (short)local_38;
        opj_read_bytes_LE(local_18,&local_38,2);
        local_18 = local_18 + 2;
        *(short *)((long)local_30 + (ulong)local_32 * 6 + 2) = (short)local_38;
        opj_read_bytes_LE(local_18,&local_38,2);
        local_18 = local_18 + 2;
        *(short *)((long)local_30 + (ulong)local_32 * 6 + 4) = (short)local_38;
      }
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static opj_bool jp2_read_cdef_v2(	opj_jp2_v2_t * jp2,
							unsigned char * p_cdef_header_data,
							OPJ_UINT32 p_cdef_header_size,
							opj_event_mgr_t * p_manager
						  )
{
	opj_jp2_cdef_info_t *cdef_info;
	unsigned short i;
	OPJ_UINT32 l_value;

	/* preconditions */
	assert(jp2 != 00);
	assert(p_cdef_header_data != 00);
	assert(p_manager != 00);

	/* Part 1, I.5.3.6: 'The shall be at most one Channel Definition box
	 * inside a JP2 Header box.'*/
	if(jp2->color.jp2_cdef) return OPJ_FALSE;

	opj_read_bytes(p_cdef_header_data,&l_value ,2);			/* N */
	p_cdef_header_data+= 2;

	if ( (OPJ_UINT16)l_value == 0){ /* szukw000: FIXME */
		opj_event_msg_v2(p_manager, EVT_ERROR, "Number of channel description is equal to zero in CDEF box.\n");
		return OPJ_FALSE;
	}

	cdef_info = (opj_jp2_cdef_info_t*) opj_malloc(l_value * sizeof(opj_jp2_cdef_info_t));

	jp2->color.jp2_cdef = (opj_jp2_cdef_t*)opj_malloc(sizeof(opj_jp2_cdef_t));
	jp2->color.jp2_cdef->info = cdef_info;
	jp2->color.jp2_cdef->n = (OPJ_UINT16) l_value;

	for(i = 0; i < jp2->color.jp2_cdef->n; ++i) {
		opj_read_bytes(p_cdef_header_data, &l_value, 2);			/* Cn^i */
		p_cdef_header_data +=2;
		cdef_info[i].cn = (OPJ_UINT16) l_value;

		opj_read_bytes(p_cdef_header_data, &l_value, 2);			/* Typ^i */
		p_cdef_header_data +=2;
		cdef_info[i].typ = (OPJ_UINT16) l_value;

		opj_read_bytes(p_cdef_header_data, &l_value, 2);			/* Asoc^i */
		p_cdef_header_data +=2;
		cdef_info[i].asoc = (OPJ_UINT16) l_value;
   }

	return OPJ_TRUE;
}